

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O3

void lj_err_optype(lua_State *L,cTValue *o,ErrMsg opm)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *oname;
  char *local_20;
  
  uVar1 = (o->field_2).it;
  uVar4 = 0xd;
  if ((0xfffeffff < uVar1) && (uVar4 = 3, (uVar1 & 0xffff8000) != 0xffff0000)) {
    uVar4 = (ulong)~uVar1;
  }
  pcVar2 = lj_obj_itypename[uVar4];
  uVar4 = (ulong)L->base[-1].u32.lo;
  pcVar5 = lj_err_allmsg + (int)opm;
  if (*(char *)(uVar4 + 6) == '\0') {
    local_20 = (char *)0x0;
    pcVar3 = lj_debug_slotname((GCproto *)((ulong)*(uint *)(uVar4 + 0x10) - 0x40),
                               (BCIns *)((ulong)*(uint *)(((ulong)L->cframe & 0xfffffffffffffffc) +
                                                         0x1c) - 4),
                               (BCReg)((ulong)((long)o - (long)L->base) >> 3),&local_20);
    if (pcVar3 != (char *)0x0) {
      err_msgv(L,LJ_ERR_BADOPRT,pcVar5,pcVar3,local_20,pcVar2);
    }
  }
  err_msgv(L,LJ_ERR_BADOPRV,pcVar5,pcVar2);
}

Assistant:

LJ_NOINLINE void lj_err_optype(lua_State *L, cTValue *o, ErrMsg opm)
{
  const char *tname = lj_typename(o);
  const char *opname = err2msg(opm);
  if (curr_funcisL(L)) {
    GCproto *pt = curr_proto(L);
    const BCIns *pc = cframe_Lpc(L) - 1;
    const char *oname = NULL;
    const char *kind = lj_debug_slotname(pt, pc, (BCReg)(o-L->base), &oname);
    if (kind)
      err_msgv(L, LJ_ERR_BADOPRT, opname, kind, oname, tname);
  }
  err_msgv(L, LJ_ERR_BADOPRV, opname, tname);
}